

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

action Search::single_prediction_LDF
                 (search_private *priv,example *ecs,size_t ec_cnt,int policy,float *a_cost,
                 action override_action)

{
  label *this;
  example *target;
  wclass **ppwVar1;
  int iVar2;
  action aVar3;
  BaseTask *pBVar4;
  uint64_t uVar5;
  label_t lVar6;
  wclass *pwVar7;
  size_t sVar8;
  float *pfVar9;
  v_array<Search::action_cache> *this_00;
  bool bVar10;
  uint uVar11;
  multi_learner *pmVar12;
  long *plVar13;
  ulong uVar14;
  long lVar15;
  action_cache *__ptr;
  uint uVar16;
  action aVar17;
  ulong uVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  multi_ex tmp;
  v_array<Search::action_cache> *this_cache;
  polylabel old_label;
  wclass wc;
  float local_ec;
  ulong local_e0;
  action_cache local_c8;
  long *local_b8;
  long *plStack_b0;
  undefined8 local_a8;
  float *local_a0;
  size_t local_98;
  ulong local_90;
  v_array<Search::action_cache> *local_88;
  label *local_80;
  label_t local_78;
  label_t lStack_70;
  wclass *local_68;
  size_t sStack_60;
  size_t local_58;
  wclass local_48;
  
  pBVar4 = priv->metaoverride;
  bVar19 = true;
  if (((pBVar4 == (BaseTask *)0x0 || priv->metatask == (search_metatask *)0x0) ||
       priv->state != INIT_TRAIN) &&
     ((pBVar4 == (BaseTask *)0x0 ||
      (pBVar4->_foreach_action == (_func_void_search_ptr_size_t_float_action_bool_float *)0x0)))) {
    bVar19 = override_action != 0xffffffff;
  }
  this = &priv->ldf_test_label;
  local_a0 = a_cost;
  local_98 = ec_cnt;
  (*(code *)COST_SENSITIVE::cs_label)(this);
  local_48.x = 0.0;
  local_48.class_index = 1;
  local_48.partial_prediction = 0.0;
  local_48.wap_value = 0.0;
  local_80 = this;
  v_array<COST_SENSITIVE::wclass>::push_back(&this->costs,&local_48);
  if (priv->is_ldf == true) {
    bVar10 = COST_SENSITIVE::ec_is_example_header(ecs);
  }
  else {
    bVar10 = false;
  }
  uVar11 = (uint)bVar10;
  local_88 = (v_array<Search::action_cache> *)0x0;
  local_e0._0_4_ = 0;
  if (bVar19) {
    local_88 = (v_array<Search::action_cache> *)operator_new(0x20);
    local_88->_begin = (action_cache *)0x0;
    local_88->_end = (action_cache *)0x0;
    local_88->end_array = (action_cache *)0x0;
    local_88->erase_count = 0;
  }
  this_00 = local_88;
  local_ec = 0.0;
  if (uVar11 < local_98) {
    local_90 = (ulong)(uint)policy;
    local_e0 = 0;
    local_ec = 0.0;
    uVar18 = (ulong)uVar11;
    do {
      if (uVar11 != 0) {
        LabelDict::add_example_namespaces_from_example(ecs + uVar18,ecs);
      }
      target = ecs + uVar18;
      local_58 = ecs[uVar18].l.cb_eval.event.costs.erase_count;
      local_78 = ecs[uVar18].l.multi;
      lStack_70 = (&ecs[uVar18].l.multi)[1];
      ppwVar1 = &ecs[uVar18].l.cs.costs.end_array;
      local_68 = *ppwVar1;
      sStack_60 = (size_t)ppwVar1[1];
      lVar6 = (label_t)(local_80->costs)._end;
      pwVar7 = (local_80->costs).end_array;
      sVar8 = (local_80->costs).erase_count;
      ecs[uVar18].l.multi = (label_t)(local_80->costs)._begin;
      (&ecs[uVar18].l.multi)[1] = lVar6;
      ppwVar1 = &ecs[uVar18].l.cs.costs.end_array;
      *ppwVar1 = pwVar7;
      ppwVar1[1] = (wclass *)sVar8;
      local_b8 = (long *)0x0;
      plStack_b0 = (long *)0x0;
      local_a8 = 0;
      uVar5 = ecs[uVar18].super_example_predict.ft_offset;
      ecs[uVar18].super_example_predict.ft_offset = priv->offset;
      local_c8._0_8_ = target;
      std::vector<example*,std::allocator<example*>>::_M_realloc_insert<example*>
                ((vector<example*,std::allocator<example*>> *)&local_b8,(iterator)0x0,
                 (example **)&local_c8);
      pmVar12 = LEARNER::as_multiline<char,char>(priv->base_learner);
      if (local_b8 != plStack_b0) {
        iVar2 = *(int *)(pmVar12 + 0xe0);
        plVar13 = local_b8;
        do {
          *(long *)(*plVar13 + 0x6820) =
               *(long *)(*plVar13 + 0x6820) + (ulong)(uint)(iVar2 * (int)local_90);
          plVar13 = plVar13 + 1;
        } while (plVar13 != plStack_b0);
      }
      (**(code **)(pmVar12 + 0x30))
                (*(undefined8 *)(pmVar12 + 0x18),*(undefined8 *)(pmVar12 + 0x20),&local_b8);
      if (local_b8 != plStack_b0) {
        iVar2 = *(int *)(pmVar12 + 0xe0);
        plVar13 = local_b8;
        do {
          *(long *)(*plVar13 + 0x6820) =
               *(long *)(*plVar13 + 0x6820) - (ulong)(uint)(iVar2 * (int)local_90);
          plVar13 = plVar13 + 1;
        } while (plVar13 != plStack_b0);
      }
      (target->super_example_predict).ft_offset = uVar5;
      uVar16 = (uint)uVar18;
      if (override_action == 0xffffffff) {
        fVar20 = target->partial_prediction;
        uVar14 = uVar18;
        fVar21 = fVar20;
        if ((uVar16 == uVar11) || (fVar20 < local_ec)) goto LAB_00252a5a;
      }
      else if (uVar16 == override_action) {
        fVar20 = target->partial_prediction;
        uVar14 = local_e0;
        fVar21 = local_ec;
LAB_00252a5a:
        *local_a0 = fVar20;
        local_ec = fVar21;
        local_e0 = uVar14;
      }
      if (this_00 != (v_array<Search::action_cache> *)0x0) {
        local_c8.cost = target->partial_prediction;
        local_c8._0_8_ = uVar18 << 0x20;
        local_c8.is_opt = false;
        v_array<Search::action_cache>::push_back(this_00,&local_c8);
      }
      priv->num_features = priv->num_features + target->num_features;
      ecs[uVar18].l.cb_eval.event.costs.erase_count = local_58;
      ecs[uVar18].l.cs.costs.end_array = local_68;
      ecs[uVar18].l.cs.costs.erase_count = sStack_60;
      ecs[uVar18].l.multi = local_78;
      ecs[uVar18].l.cs.costs._end = (wclass *)lStack_70;
      if (uVar11 != 0) {
        LabelDict::del_example_namespaces_from_example(target,ecs);
      }
      if (local_b8 != (long *)0x0) {
        operator_delete(local_b8);
      }
      uVar18 = (ulong)(uVar16 + 1);
    } while (uVar18 < local_98);
  }
  pfVar9 = local_a0;
  aVar17 = override_action;
  if (override_action == 0xffffffff) {
    *local_a0 = local_ec;
    aVar17 = (action)local_e0;
  }
  if (this_00 != (v_array<Search::action_cache> *)0x0) {
    __ptr = this_00->_begin;
    if (this_00->_end != __ptr) {
      lVar15 = 0xc;
      uVar18 = 0;
      do {
        fVar20 = *pfVar9;
        *(float *)((long)__ptr + lVar15 + -0xc) = fVar20;
        aVar3 = *(action *)((long)__ptr + lVar15 + -8);
        *(bool *)((long)__ptr + lVar15 + -4) = aVar3 == aVar17;
        pBVar4 = priv->metaoverride;
        if ((pBVar4 != (BaseTask *)0x0) &&
           (pBVar4->_foreach_action != (_func_void_search_ptr_size_t_float_action_bool_float *)0x0))
        {
          (*pBVar4->_foreach_action)
                    (pBVar4->sch,priv->t - 1,fVar20,aVar3,aVar3 == aVar17,
                     *(float *)((long)&__ptr->min_cost + lVar15));
        }
        uVar18 = uVar18 + 1;
        __ptr = this_00->_begin;
        lVar15 = lVar15 + 0x10;
      } while (uVar18 < (ulong)((long)this_00->_end - (long)__ptr >> 4));
    }
    if ((((priv->state == INIT_TRAIN) && (priv->metatask != (search_metatask *)0x0)) &&
        (override_action == 0xffffffff)) && (priv->metaoverride != (BaseTask *)0x0)) {
      v_array<v_array<Search::action_cache>_*>::push_back(&priv->memo_foreach_action,&local_88);
    }
    else {
      if (__ptr != (action_cache *)0x0) {
        free(__ptr);
      }
      operator_delete(this_00);
    }
  }
  priv->total_predictions_made = priv->total_predictions_made + 1;
  return aVar17;
}

Assistant:

action single_prediction_LDF(search_private& priv, example* ecs, size_t ec_cnt, int policy, float& a_cost,
    action override_action)  // if override_action != -1, then we return it as the action and a_cost is set to the
                             // appropriate cost for that action
{
  bool need_partial_predictions = need_memo_foreach_action(priv) ||
      (priv.metaoverride && priv.metaoverride->_foreach_action) || (override_action != (action)-1);

  CS::cs_label.default_label(&priv.ldf_test_label);
  CS::wclass wc = {0., 1, 0., 0.};
  priv.ldf_test_label.costs.push_back(wc);

  // keep track of best (aka chosen) action
  float best_prediction = 0.;
  action best_action = 0;

  size_t start_K = (priv.is_ldf && COST_SENSITIVE::ec_is_example_header(ecs[0])) ? 1 : 0;

  v_array<action_cache>* this_cache = nullptr;
  if (need_partial_predictions)
  {
    this_cache = new v_array<action_cache>();
    *this_cache = v_init<action_cache>();
  }

  for (action a = (uint32_t)start_K; a < ec_cnt; a++)
  {
    cdbg << "== single_prediction_LDF a=" << a << "==" << endl;
    if (start_K > 0)
      LabelDict::add_example_namespaces_from_example(ecs[a], ecs[0]);

    polylabel old_label = ecs[a].l;
    ecs[a].l.cs = priv.ldf_test_label;

    multi_ex tmp;
    uint64_t old_offset = ecs[a].ft_offset;
    ecs[a].ft_offset = priv.offset;
    tmp.push_back(&ecs[a]);
    as_multiline(priv.base_learner)->predict(tmp, policy);

    ecs[a].ft_offset = old_offset;
    cdbg << "partial_prediction[" << a << "] = " << ecs[a].partial_prediction << endl;

    if (override_action != (action)-1)
    {
      if (a == override_action)
        a_cost = ecs[a].partial_prediction;
    }
    else if ((a == start_K) || (ecs[a].partial_prediction < best_prediction))
    {
      best_prediction = ecs[a].partial_prediction;
      best_action = a;
      a_cost = best_prediction;
    }
    if (this_cache)
      this_cache->push_back(action_cache(0., a, false, ecs[a].partial_prediction));

    priv.num_features += ecs[a].num_features;
    ecs[a].l = old_label;
    if (start_K > 0)
      LabelDict::del_example_namespaces_from_example(ecs[a], ecs[0]);
  }
  if (override_action != (action)-1)
    best_action = override_action;
  else
    a_cost = best_prediction;

  if (this_cache)
  {
    for (size_t i = 0; i < this_cache->size(); i++)
    {
      action_cache& ac = (*this_cache)[i];
      ac.min_cost = a_cost;
      ac.is_opt = (ac.k == best_action);
      if (priv.metaoverride && priv.metaoverride->_foreach_action)
        priv.metaoverride->_foreach_action(*priv.metaoverride->sch, priv.t - 1, ac.min_cost, ac.k, ac.is_opt, ac.cost);
    }
    if (need_memo_foreach_action(priv) && (override_action == (action)-1))
      priv.memo_foreach_action.push_back(this_cache);
    else
    {
      this_cache->delete_v();
      delete this_cache;
    }
  }

  // TODO: generate raw predictions if necessary

  priv.total_predictions_made++;
  return best_action;
}